

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_link(DisasContext_conflict2 *s,uint16_t insn,int32_t offset)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_i32 ret;
  TCGv_i32 arg1;
  TCGv_i32 tmp;
  TCGv_i32 reg;
  TCGContext_conflict2 *tcg_ctx;
  int32_t offset_local;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  pTVar1 = get_areg(s,insn & 7);
  ret = tcg_temp_new_i32(tcg_ctx_00);
  arg1 = get_areg(s,7);
  tcg_gen_subi_i32_m68k(tcg_ctx_00,ret,arg1,4);
  gen_store(s,2,ret,pTVar1,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if ((insn & 7) != 7) {
    tcg_gen_mov_i32(tcg_ctx_00,pTVar1,ret);
  }
  pTVar1 = get_areg(s,7);
  tcg_gen_addi_i32_m68k(tcg_ctx_00,pTVar1,ret,offset);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_link(DisasContext *s, uint16_t insn, int32_t offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;

    reg = AREG(insn, 0);
    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_subi_i32(tcg_ctx, tmp, QREG_SP, 4);
    gen_store(s, OS_LONG, tmp, reg, IS_USER(s));
    if ((insn & 7) != 7) {
        tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    }
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, tmp, offset);
    tcg_temp_free(tcg_ctx, tmp);
}